

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

void matchit::impl::
     IdUtil<std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>>
     ::bindValue<mathiu::impl::Sum_const&>
               (_Variadic_union<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*,_const_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*>
                *v,_Variadic_union<std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*,_const_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*>
                   value)

{
  _Variadic_union<std::monostate,_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*,_const_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*>
  local_38;
  undefined1 local_8;
  
  local_8 = 3;
  local_38._M_rest._M_rest = value;
  if (*(variant<std::monostate,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>*,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>const*>
        *)(v + 6) ==
      (variant<std::monostate,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>*,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>const*>
       )0x3) {
    *v = value;
  }
  else {
    std::
    variant<std::monostate,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>*,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>const*>
    ::
    emplace<3ul,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>const*>
              ((variant<std::monostate,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>*,std::map<std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>,mathiu::impl::ExprPtrLess,std::allocator<std::pair<std::shared_ptr<mathiu::impl::Expr_const>const,std::shared_ptr<mathiu::impl::Expr_const>>>>const*>
                *)&v->_M_first,
               (map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                **)&local_38);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*,_const_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>,_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*,_const_std::map<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_mathiu::impl::ExprPtrLess,_std::allocator<std::pair<const_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_*>
                       *)&local_38);
  return;
}

Assistant:

constexpr static auto bindValue(ValueVariant<Type> &v, Value &&value,
                                                    std::true_type /* StorePointer */)
            {
                v = ValueVariant<Type>{&value};
            }